

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
dynamic_xpression<boost::xpressive::detail::any_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::match(dynamic_xpression<boost::xpressive::detail::any_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *state)

{
  char *pcVar1;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar2;
  int iVar3;
  
  pcVar1 = (state->cur_)._M_current;
  if (pcVar1 == (state->end_)._M_current) {
    state->found_partial_match_ = true;
  }
  else {
    pmVar2 = (this->next_).xpr_.px;
    (state->cur_)._M_current = pcVar1 + 1;
    iVar3 = (*(pmVar2->
              super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_matchable[2])(pmVar2,state);
    if ((char)iVar3 != '\0') {
      return true;
    }
    (state->cur_)._M_current = (state->cur_)._M_current + -1;
  }
  return false;
}

Assistant:

virtual bool match(match_state<BidiIter> &state) const
    {
        return this->Matcher::match(state, *this->next_.matchable());
    }